

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamHeader::ReadHeaderLength(BamHeader *this,BgzfStream *stream,uint32_t *length)

{
  size_t sVar1;
  BamException *this_00;
  char buffer [4];
  uint32_t local_6c;
  string local_68;
  string local_48;
  
  sVar1 = BgzfStream::Read(stream,(char *)&local_6c,4);
  if (sVar1 == 4) {
    *length = local_6c;
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamHeader::ReadHeaderLength","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not read header length","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamHeader::ReadHeaderLength(BgzfStream* stream, uint32_t& length)
{

    // read BAM header text length
    char buffer[sizeof(uint32_t)];
    const std::size_t numBytesRead = stream->Read(buffer, sizeof(uint32_t));
    if (numBytesRead != sizeof(uint32_t))
        throw BamException("BamHeader::ReadHeaderLength", "could not read header length");

    // convert char buffer to length
    length = BamTools::UnpackUnsignedInt(buffer);
    if (BamTools::SystemIsBigEndian()) BamTools::SwapEndian_32(length);
}